

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlunicode.c
# Opt level: O3

int xmlUCSIsCatCo(int code)

{
  if (code < 0xf0000) {
    if ((code != 0xe000) && (code != 0xf8ff)) goto LAB_0017debf;
  }
  else if ((code != 0xf0000) && ((code != 0xffffd && (code != 0x100000)))) {
LAB_0017debf:
    return (int)(code == 0x10fffd);
  }
  return 1;
}

Assistant:

int
xmlUCSIsCatCo(int code) {
    return((code == 0xe000) ||
           (code == 0xf8ff) ||
           (code == 0xf0000) ||
           (code == 0xffffd) ||
           (code == 0x100000) ||
           (code == 0x10fffd));
}